

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeModuleGetNativeBinary
          (ze_module_handle_t hModule,size_t *pSize,uint8_t *pModuleNativeBinary)

{
  ze_pfnModuleGetNativeBinary_t pfnGetNativeBinary;
  ze_result_t result;
  uint8_t *pModuleNativeBinary_local;
  size_t *pSize_local;
  ze_module_handle_t hModule_local;
  
  pfnGetNativeBinary._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c648 != (code *)0x0) {
    pfnGetNativeBinary._4_4_ = (*DAT_0011c648)(hModule,pSize,pModuleNativeBinary);
  }
  return pfnGetNativeBinary._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleGetNativeBinary(
        ze_module_handle_t hModule,                     ///< [in] handle of the module
        size_t* pSize,                                  ///< [in,out] size of native binary in bytes.
        uint8_t* pModuleNativeBinary                    ///< [in,out][optional] byte pointer to native binary
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetNativeBinary = context.zeDdiTable.Module.pfnGetNativeBinary;
        if( nullptr != pfnGetNativeBinary )
        {
            result = pfnGetNativeBinary( hModule, pSize, pModuleNativeBinary );
        }
        else
        {
            // generic implementation
        }

        return result;
    }